

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GenEnum
          (PythonGenerator *this,EnumDef *enum_def,string *code_ptr)

{
  EnumVal *ev_00;
  const_iterator code_ptr_00;
  bool bVar1;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar2;
  reference ppEVar3;
  char *prefix;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_28;
  const_iterator it;
  string *code_ptr_local;
  EnumDef *enum_def_local;
  PythonGenerator *this_local;
  
  if (((enum_def->super_Definition).generated & 1U) == 0) {
    it._M_current = (EnumVal **)code_ptr;
    GenComment(&(enum_def->super_Definition).doc_comment,code_ptr,
               (CommentConfig *)(anonymous_namespace)::def_comment,"");
    BeginEnum(this,enum_def,(string *)it._M_current);
    pvVar2 = EnumDef::Vals(enum_def);
    local_28._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar2)
    ;
    while( true ) {
      pvVar2 = EnumDef::Vals(enum_def);
      ev = (EnumVal *)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar2)
      ;
      bVar1 = __gnu_cxx::operator!=
                        (&local_28,
                         (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                          *)&ev);
      if (!bVar1) break;
      ppEVar3 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                ::operator*(&local_28);
      code_ptr_00 = it;
      ev_00 = *ppEVar3;
      prefix = (char *)std::__cxx11::string::c_str();
      GenComment(&ev_00->doc_comment,(string *)code_ptr_00._M_current,
                 (CommentConfig *)(anonymous_namespace)::def_comment,prefix);
      EnumMember(this,enum_def,ev_00,(string *)it._M_current);
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&local_28);
    }
  }
  return;
}

Assistant:

void GenEnum(const EnumDef &enum_def, std::string *code_ptr) const {
    if (enum_def.generated) return;

    GenComment(enum_def.doc_comment, code_ptr, &def_comment);
    BeginEnum(enum_def, code_ptr);
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      GenComment(ev.doc_comment, code_ptr, &def_comment, Indent.c_str());
      EnumMember(enum_def, ev, code_ptr);
    }
  }